

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

int __thiscall StringBTree::lessThanKeyCompareOp(StringBTree *this,KeyType *key,uint8_t *data)

{
  int iVar1;
  uint8_t *local_20;
  
  local_20 = data;
  decodeBitsAndAdvance(&local_20);
  iVar1 = equalKeyCompareOp(this,key,local_20);
  return iVar1 + (uint)(iVar1 == 0);
}

Assistant:

int lessThanKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		// TODO: figure out
		const auto unk = static_cast<uint32_t>(decodeBitsAndAdvance(data));

		const auto result = equalKeyCompareOp(key, data);
		
		return (result != 0) ? result : 1;
	}